

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O3

void __thiscall antlr::InputBuffer::fill(InputBuffer *this,uint amount)

{
  pointer __src;
  ulong uVar1;
  iterator __position;
  int iVar2;
  undefined8 in_RAX;
  pointer piVar3;
  ulong uVar4;
  size_t sVar5;
  pointer piVar6;
  ulong uVar7;
  int *piVar8;
  pointer piVar9;
  undefined8 uStack_28;
  
  uVar7 = (ulong)this->numToConsume;
  uStack_28 = in_RAX;
  if (uVar7 != 0) {
    if (this->nMarkers == 0) {
      piVar9 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar1 = (this->queue).m_offset;
      uVar4 = ((long)piVar3 - (long)piVar9 >> 2) - uVar1;
      if (uVar7 <= uVar4) {
        uVar4 = uVar7;
      }
      if (uVar1 < 5000) {
        sVar5 = uVar4 + uVar1;
      }
      else {
        __src = piVar9 + uVar1 + uVar4;
        if (piVar9 != __src) {
          piVar6 = __src;
          if ((long)piVar3 - (long)__src != 0) {
            memmove(piVar9,__src,(long)piVar3 - (long)__src);
            piVar3 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            piVar6 = piVar3;
          }
          piVar9 = (pointer)((long)piVar9 + ((long)piVar6 - (long)__src));
          if (piVar3 != piVar9) {
            (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar9;
          }
        }
        sVar5 = 0;
      }
      (this->queue).m_offset = sVar5;
    }
    else {
      this->markerOffset = this->markerOffset + this->numToConsume;
    }
    this->numToConsume = 0;
  }
  if (((long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) - (this->queue).m_offset <
      (ulong)(this->markerOffset + amount)) {
    do {
      iVar2 = (*this->_vptr_InputBuffer[5])(this);
      uStack_28 = CONCAT44(iVar2,(undefined4)uStack_28);
      __position._M_current =
           (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->queue,__position,
                   (int *)((long)&uStack_28 + 4));
        piVar8 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = iVar2;
        piVar8 = __position._M_current + 1;
        (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar8;
      }
    } while (((long)piVar8 -
              (long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) - (this->queue).m_offset <
             (ulong)(this->markerOffset + amount));
  }
  return;
}

Assistant:

void InputBuffer::fill(unsigned int amount)
{
	syncConsume();

	// Fill the buffer sufficiently to hold needed characters
	while (queue.entries() < amount + markerOffset)
        {         
            // Append the next character
            queue.append(getChar());            
	}
}